

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O1

void __thiscall muduo::Logger::Impl::finish(Impl *this)

{
  char **ppcVar1;
  char *pcVar2;
  LogStream *pLVar3;
  char **ppcVar4;
  ulong __n;
  int iVar5;
  
  ppcVar4 = &(this->stream_).buffer_.cur_;
  pcVar2 = (this->stream_).buffer_.cur_;
  iVar5 = (int)ppcVar4;
  if ((iVar5 - (int)pcVar2 & 0xfffffffcU) != 0) {
    pcVar2[2] = ' ';
    pcVar2[0] = ' ';
    pcVar2[1] = '-';
    *ppcVar4 = *ppcVar4 + 3;
  }
  __n = (ulong)(this->basename_).size_;
  pcVar2 = (this->stream_).buffer_.cur_;
  if (__n < (ulong)(long)(iVar5 - (int)pcVar2)) {
    memcpy(pcVar2,(this->basename_).data_,__n);
    ppcVar1 = &(this->stream_).buffer_.cur_;
    *ppcVar1 = *ppcVar1 + __n;
  }
  if ((iVar5 - (int)*ppcVar4 & 0xfffffffeU) != 0) {
    **ppcVar4 = ':';
    *ppcVar4 = *ppcVar4 + 1;
  }
  pLVar3 = LogStream::operator<<(&this->stream_,this->line_);
  pcVar2 = (pLVar3->buffer_).cur_;
  ppcVar4 = &(pLVar3->buffer_).cur_;
  if (((int)ppcVar4 - (int)pcVar2 & 0xfffffffeU) != 0) {
    *pcVar2 = '\n';
    *ppcVar4 = *ppcVar4 + 1;
  }
  return;
}

Assistant:

void Logger::Impl::finish()
{
  stream_ << " - " << basename_ << ':' << line_ << '\n';
}